

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          Index binding_index_offset)

{
  undefined4 uVar1;
  bool bVar2;
  Result RVar3;
  size_type sVar4;
  Binding local_c0;
  uint local_94;
  Enum local_90;
  undefined1 local_80 [8];
  Location loc;
  undefined1 local_58 [4];
  Type type;
  string name;
  Index binding_index_offset_local;
  BindingHash *bindings_local;
  TypeVector *types_local;
  TokenType token_local;
  WastParser *this_local;
  
  name.field_2._12_4_ = binding_index_offset;
  do {
    bVar2 = MatchLpar(this,token);
    if (!bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    bVar2 = PeekMatch(this,Last_String);
    if (bVar2) {
      std::__cxx11::string::string((string *)local_58);
      GetLocation((Location *)local_80,this);
      ParseBindVarOpt(this,(string *)local_58);
      local_90 = (Enum)ParseValueType(this,(Type *)((long)&loc.field_1 + 0xc));
      bVar2 = Failed((Result)local_90);
      uVar1 = name.field_2._12_4_;
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        sVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
        Binding::Binding(&local_c0,(Location *)local_80,uVar1 + (int)sVar4);
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)bindings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_c0);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                  (types,(value_type *)((long)&loc.field_1 + 0xc));
      }
      local_94 = (uint)bVar2;
      std::__cxx11::string::~string((string *)local_58);
      if (local_94 != 0) {
        return (Result)this_local._4_4_;
      }
    }
    else {
      RVar3 = ParseValueTypeList(this,types);
      bVar2 = Failed(RVar3);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    RVar3 = Expect(this,Rpar);
    bVar2 = Failed(RVar3);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Type type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      types->push_back(type);
    } else {
      CHECK_RESULT(ParseValueTypeList(types));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}